

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f,int horn)

{
  int iVar1;
  param512_t *papVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  qnode_ptr_t q;
  int iVar6;
  long lVar7;
  int iVar8;
  int y;
  long lVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  int local_58;
  
  iVar8 = f->ofst;
  iVar3 = f->sizy - iVar8;
  q = f;
  iVar4 = iVar8;
  if (iVar8 < iVar3) {
    do {
      for (; iVar8 < f->sizx - f->ofst; iVar8 = iVar8 + 1) {
        if (0 < f->sizz) {
          lVar7 = 0;
          do {
            fVar10 = dx(c,f,iVar4,iVar8,(int)lVar7);
            (*f->param_ptr[lVar7])[f->res * iVar4 + iVar8].fx = fVar10;
            q = f;
            fVar10 = dy(c,f,iVar4,iVar8,(int)lVar7);
            (*f->param_ptr[lVar7])[f->res * iVar4 + iVar8].fy = fVar10;
            lVar7 = lVar7 + 1;
          } while (lVar7 < f->sizz);
        }
      }
      iVar4 = iVar4 + 1;
      iVar8 = f->ofst;
      iVar3 = f->sizy - iVar8;
    } while (iVar4 < iVar3);
  }
  iVar4 = c->sizz / 2;
  if (iVar8 < iVar3) {
    iVar1 = f->sizx;
    local_58 = iVar8;
    do {
      if (iVar8 < iVar1 - iVar8) {
        piVar5 = &(*f->param_ptr[iVar4])[(long)local_58 * (long)f->res + (long)iVar8].err;
        iVar6 = iVar1 + iVar8 * -2;
        y = iVar8;
        do {
          if (*piVar5 == 0) {
            fVar10 = dt(c,q,local_58,y);
            piVar5[-4] = (int)fVar10;
          }
          y = y + 1;
          piVar5 = piVar5 + 8;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      local_58 = local_58 + 1;
    } while (local_58 != iVar3);
  }
  if ((horn == 0) && (iVar3 = f->ofst, iVar8 < f->sizy - iVar3)) {
    do {
      if (iVar3 < f->sizx - f->ofst) {
        lVar9 = (long)iVar3;
        lVar7 = (long)iVar8;
        do {
          if ((*f->param_ptr[iVar4])[f->res * lVar7 + lVar9].err == 0) {
            iVar3 = (int)lVar9;
            fVar10 = dxx(f,iVar8,iVar3,iVar4);
            (*f->param_ptr[iVar4])[f->res * lVar7 + lVar9].fxx = fVar10;
            fVar10 = dyy(f,iVar8,iVar3,iVar4);
            (*f->param_ptr[iVar4])[f->res * lVar7 + lVar9].fyy = fVar10;
            fVar10 = dxy(f,iVar8,iVar3,iVar4);
            (*f->param_ptr[iVar4])[f->res * lVar7 + lVar9].fxy = fVar10;
          }
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 < f->sizx - f->ofst);
      }
      iVar8 = iVar8 + 1;
      iVar3 = f->ofst;
    } while (iVar8 < f->sizy - iVar3);
  }
  iVar8 = f->ofst;
  if (iVar8 < f->sizy - iVar8) {
    iVar3 = iVar8;
    do {
      if (iVar8 < f->sizx - f->ofst) {
        lVar7 = (long)iVar8;
        do {
          papVar2 = f->param_ptr[iVar4];
          lVar9 = (long)f->res * (long)iVar3 + lVar7;
          if ((*papVar2)[lVar9].err == 0) {
            dVar12 = (double)(*papVar2)[lVar9].fx;
            dVar11 = (double)(*papVar2)[lVar9].fy;
            dVar11 = dVar11 * dVar11 + dVar12 * dVar12;
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            (*f->param_ptr[iVar4])[(long)f->res * (long)iVar3 + lVar7].mag = (float)dVar11;
          }
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < f->sizx - f->ofst);
      }
      iVar3 = iVar3 + 1;
      iVar8 = f->ofst;
    } while (iVar3 < f->sizy - iVar8);
  }
  return;
}

Assistant:

void compute_deriv(qnode_ptr_t c, qnode_ptr_t f, int horn)
{ float dxx(), dyy(), dxy(), dx(), dy(), dt() ;
  param_t P ;
  int i, j, k ;

  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
      }
    }
  }
  if (!horn) {
    for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
      for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
        if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
          (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
        }
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        P = (*f->param_ptr[k])[f->res*i + j] ;
        (*f->param_ptr[k])[f->res*i + j].mag =
        sqrt(pow(P.fx,2.0) + pow(P.fy,2.0)) ;
      }
    }
  }
}